

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O1

Hop_Obj_t *
Nwk_NodeIfToHop2_rec(Hop_Man_t *pHopMan,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited)

{
  If_Obj_t **ppIVar1;
  uint uVar2;
  void **ppvVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pHVar5;
  int iVar6;
  If_Obj_t *pIVar7;
  
  if (*(Hop_Obj_t **)&pIfObj->CutBest != (Hop_Obj_t *)0x0) {
    return *(Hop_Obj_t **)&pIfObj->CutBest;
  }
  uVar2 = vVisited->nCap;
  if (vVisited->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vVisited->pArray,0x80);
      }
      vVisited->pArray = ppvVar3;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_00495109;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vVisited->pArray,(ulong)uVar2 << 4);
      }
      vVisited->pArray = ppvVar3;
    }
    vVisited->nCap = iVar6;
  }
LAB_00495109:
  iVar6 = vVisited->nSize;
  vVisited->nSize = iVar6 + 1;
  vVisited->pArray[iVar6] = &pIfObj->CutBest;
  (pIfObj->CutBest).Area = 1.4013e-45;
  (pIfObj->CutBest).Edge = 0.0;
  pHVar4 = (Hop_Obj_t *)0x1;
  pIVar7 = pIfObj;
  if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) != (undefined1  [112])0x2) {
    do {
      pHVar4 = Nwk_NodeIfToHop2_rec(pHopMan,pIfMan,pIVar7->pFanin0,vVisited);
      if ((pHVar4 != (Hop_Obj_t *)0x1) &&
         (pHVar5 = Nwk_NodeIfToHop2_rec(pHopMan,pIfMan,pIVar7->pFanin1,vVisited),
         pHVar5 != (Hop_Obj_t *)0x1)) {
        pHVar5 = Hop_And(pHopMan,(Hop_Obj_t *)((ulong)(*(uint *)pIVar7 >> 4 & 1) ^ (ulong)pHVar4),
                         (Hop_Obj_t *)((ulong)(*(uint *)pIVar7 >> 5 & 1) ^ (ulong)pHVar5));
        pHVar4 = (Hop_Obj_t *)((ulong)pHVar5 ^ 1);
        if (((*(uint *)pIfObj ^ *(uint *)pIVar7) & 0x40) == 0) {
          pHVar4 = pHVar5;
        }
        *(Hop_Obj_t **)&pIfObj->CutBest = pHVar4;
        break;
      }
      ppIVar1 = &pIVar7->pEquiv;
      pIVar7 = *ppIVar1;
    } while (*ppIVar1 != (If_Obj_t *)0x0);
    pHVar4 = *(Hop_Obj_t **)&pIfObj->CutBest;
  }
  return pHVar4;
}

Assistant:

static inline void *     If_CutData( If_Cut_t * pCut )                       { return *(void **)pCut;                }